

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefToken *token_,
          BitSet *set_,bool matchNot,string *fileName_)

{
  int iVar1;
  Token *pTVar2;
  TokenRefCount<antlr::Token> *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  byte in_R9B;
  BitSet *in_stack_ffffffffffffff28;
  BitSet *this_00;
  AST *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_51;
  string local_50 [39];
  byte local_29;
  undefined4 local_14;
  undefined8 local_10;
  
  local_29 = in_R9B & 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  pTVar2 = TokenRefCount<antlr::Token>::operator->(in_RCX);
  (*pTVar2->_vptr_Token[3])();
  pTVar2 = TokenRefCount<antlr::Token>::operator->(in_RCX);
  iVar1 = (*pTVar2->_vptr_Token[2])();
  RecognitionException::RecognitionException
            ((RecognitionException *)CONCAT44(iVar1,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  *in_RDI = &PTR__MismatchedTokenException_00395cf8;
  TokenRefCount<antlr::Token>::TokenRefCount
            ((TokenRefCount<antlr::Token> *)in_stack_ffffffffffffff40,
             (TokenRefCount<antlr::Token> *)in_stack_ffffffffffffff38);
  ASTRefCount<antlr::AST>::ASTRefCount
            ((ASTRefCount<antlr::AST> *)(in_RDI + 0xb),in_stack_ffffffffffffff38);
  this_00 = (BitSet *)(in_RDI + 0xc);
  pTVar2 = TokenRefCount<antlr::Token>::operator->(in_RCX);
  (*pTVar2->_vptr_Token[4])(this_00);
  *(uint *)(in_RDI + 0x10) = (local_29 & 1) + 5;
  BitSet::BitSet(this_00,in_stack_ffffffffffffff28);
  in_RDI[0x17] = local_10;
  *(undefined4 *)(in_RDI + 0x18) = local_14;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefToken token_,
	BitSet set_,
	bool matchNot,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("Mismatched Token",fileName_,token_->getLine(),token_->getColumn())
  , token(token_)
  , node(nullASTptr)
  , tokenText(token_->getText())
  , mismatchType(matchNot ? NOT_SET : SET)
  , set(set_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}